

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_type(FILE *out,Type *type,char should_print_struct_union)

{
  char *pcVar1;
  bool bVar2;
  size_t sStack_40;
  
  bVar2 = should_print_struct_union == '\0';
LAB_00144d68:
  do {
    print_type_qualifier(out,type);
    switch(((Type_Function *)type)->specifier) {
    case TS_VOID:
      pcVar1 = "void";
LAB_00144eb2:
      sStack_40 = 4;
LAB_00144eb4:
      fwrite(pcVar1,sStack_40,1,(FILE *)out);
      return;
    case TS_CHAR:
      pcVar1 = "char";
      goto LAB_00144eb2;
    case TS_INT:
      pcVar1 = "int";
      sStack_40 = 3;
      goto LAB_00144eb4;
    case TS_FLOAT:
      pcVar1 = "float";
      sStack_40 = 5;
      goto LAB_00144eb4;
    case TS_DOUBLE:
      pcVar1 = "double";
      goto LAB_00144e9c;
    case TS_STRUCT:
    case TS_UNION:
      if (!bVar2) {
        print_struct_union(out,(Struct_Union *)((Type_Function *)type)->return_type);
        return;
      }
      pcVar1 = "union";
      if (((Type_Function *)type)->specifier == TS_STRUCT) {
        pcVar1 = "struct";
      }
      fprintf((FILE *)out,pcVar1);
      return;
    case TS_ENUM:
      print_enumeration(out,(Enum *)((Type_Function *)type)->return_type);
      return;
    case TS_POINTER:
      fwrite("pointer to ",0xb,1,(FILE *)out);
      type = (Type *)((Type_Function *)type)->number_of_arguments;
      bVar2 = true;
      goto LAB_00144d68;
    case TS_ARRAY:
      fprintf((FILE *)out,"array [%zu] of ",((Type_Function *)type)->number_of_arguments);
      sStack_40 = 0x20;
      break;
    case TS_FUNC:
      fwrite("function taking arguments (",0x1b,1,(FILE *)out);
      print_function_args(out,(Type_Function *)type);
      fwrite(") returning ",0xc,1,(FILE *)out);
      sStack_40 = 0x10;
      break;
    case TS_BITFIELD:
      fprintf((FILE *)out,"%zu bits of ",((Type_Function *)type)->return_type);
      sStack_40 = 0x18;
      break;
    case TS_NONE:
      pcVar1 = "NONE";
      goto LAB_00144eb2;
    case TS_ERROR:
      pcVar1 = "ERROR!";
LAB_00144e9c:
      sStack_40 = 6;
      goto LAB_00144eb4;
    default:
      __assert_fail("!\"reached end of switch\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                    ,0x1b1,"void print_type(FILE *, struct Type *, char)");
    }
    type = *(Type **)((long)&((Type_Function *)type)->specifier + sStack_40);
  } while( true );
}

Assistant:

void print_type(FILE *out,struct Type *type,char should_print_struct_union)
{
	print_type_qualifier(out,type);
	switch(type->specifier)
	{
		case TS_VOID:
			fprintf(out,"void");return;
		case TS_CHAR:
			fprintf(out,"char");return;
		case TS_INT:
			fprintf(out,"int");return;
		case TS_FLOAT:
			fprintf(out,"float");return;
		case TS_DOUBLE:
			fprintf(out,"double");return;
		case TS_UNION:
		case TS_STRUCT:
			if(should_print_struct_union)
			{
				print_struct_union(out,((struct Type_Struct_Union*)type)->struct_union);
			}else
			{
				fprintf(out,(type->specifier==TS_STRUCT?"struct":"union"));
			}
			return;
		case TS_ENUM:
			print_enumeration(out,((struct Type_Enum*)type)->enumeration);
			return;
		case TS_POINTER:
			fprintf(out,"pointer to ");
			print_type(out,((struct Type_Pointer*)type)->points_to,0);
			return;
		case TS_ARRAY:
			fprintf(out,"array [%zu] of ",((struct Type_Array*)type)->number_of_elements);
			print_type(out,((struct Type_Array*)type)->is_array_of,should_print_struct_union);
			return;
		case TS_FUNC:
			fprintf(out,"function taking arguments (");
			print_function_args(out,(struct Type_Function*)type);
			fprintf(out,") returning ");
			print_type(out,((struct Type_Function*)type)->return_type,should_print_struct_union);
			return;
		case TS_BITFIELD:
			fprintf(out,"%zu bits of ",((struct Type_Bit_Field*)type)->number_of_bits);
			print_type(out,((struct Type_Bit_Field*)type)->base,should_print_struct_union);
			return;
		case TS_NONE:
			fprintf(out,"NONE");return;
		case TS_ERROR:
			fprintf(out,"ERROR!");return;

	}
	assert(!"reached end of switch");
}